

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

bool __thiscall CallStatement::callFinder(CallStatement *this,Token *id)

{
  code *pcVar1;
  __type _Var2;
  ulong uVar3;
  size_type sVar4;
  reference ppFVar5;
  vector<Function_*,_std::allocator<Function_*>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  vector<Function_*,_std::allocator<Function_*>_> local_38;
  int local_1c;
  Token *pTStack_18;
  int i;
  Token *id_local;
  CallStatement *this_local;
  
  local_1c = 0;
  pTStack_18 = id;
  id_local = (Token *)this;
  while( true ) {
    uVar3 = (ulong)local_1c;
    Functions::getFunctionStack(&local_38,&this->super_Functions);
    sVar4 = std::vector<Function_*,_std::allocator<Function_*>_>::size(&local_38);
    std::vector<Function_*,_std::allocator<Function_*>_>::~vector(&local_38);
    if (sVar4 <= uVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    Token::getName_abi_cxx11_(&local_58,pTStack_18);
    Functions::getFunctionStack(&local_90,&this->super_Functions);
    ppFVar5 = std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                        (&local_90,(long)local_1c);
    (*((*ppFVar5)->super_Statement)._vptr_Statement[3])(&local_78);
    _Var2 = std::operator==(&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::vector<Function_*,_std::allocator<Function_*>_>::~vector(&local_90);
    std::__cxx11::string::~string((string *)&local_58);
    if (_Var2) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool CallStatement::callFinder(const Token& id){
    for(int i = 0; i < getFunctionStack().size();i++) {
        if (id.getName() == getFunctionStack()[i]->id())
            return true;
    }
}